

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O1

void __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::set
          (Parameter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data,vector<unsigned_long,_std::allocator<unsigned_long>_> *dimension)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer puVar3;
  bool bVar4;
  uint uVar5;
  range_error *this_00;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  Parameter *pPVar9;
  Parameter *this_01;
  size_type *psVar10;
  size_t dataSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionCopy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensionWithStrLen;
  size_t first_dim;
  undefined1 local_68 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pPVar9 = (Parameter *)local_68;
  this_01 = (Parameter *)local_68;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = (pointer)0x0;
  if ((dimension->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (dimension->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_68._32_8_ =
         (long)(data->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(data->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 5;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,(iterator)0x0,
               (unsigned_long *)(local_68 + 0x20));
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,dimension);
    this_01 = pPVar9;
  }
  pbVar1 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (data->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  dataSize = (long)pbVar2 - (long)pbVar1 >> 5;
  bVar4 = isDimensionConsistent
                    (this_01,dataSize,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  if (!bVar4) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error
              (this_00,"Dimension of the data does not correspond to sent dimensions");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  local_38._8_8_ = 0;
  if (pbVar2 != pbVar1) {
    psVar10 = &pbVar1->_M_string_length;
    uVar5 = 1;
    uVar6 = 0;
    do {
      uVar7 = *psVar10;
      if (uVar6 < uVar7) {
        uVar6 = uVar7;
        local_38._8_8_ = uVar7;
      }
      uVar7 = (ulong)uVar5;
      psVar10 = psVar10 + 4;
      uVar5 = uVar5 + 1;
    } while (uVar7 < dataSize);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_68 + 0x20),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_68 + 0x20),
             (const_iterator)local_68._32_8_,(value_type_conflict3 *)(local_38._M_local_buf + 8));
  this->_data_type = CHAR;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->_param_data_string,data);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->_dimension,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_68 + 0x20));
  puVar3 = (this->_dimension).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->_dimension).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
  bVar4 = true;
  if ((lVar8 != 0) && ((lVar8 != 1 || (*puVar3 != 0)))) {
    bVar4 = false;
  }
  this->_isEmpty = bVar4;
  if ((unsigned_long *)local_68._32_8_ != (unsigned_long *)0x0) {
    operator_delete((void *)local_68._32_8_,local_38._M_allocated_capacity - local_68._32_8_);
  }
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ - local_68._0_8_);
  }
  return;
}

Assistant:

void ezc3d::ParametersNS::GroupNS::Parameter::set(
    const std::vector<std::string> &data,
    const std::vector<size_t> &dimension) {
  std::vector<size_t> dimensionCopy;
  if (dimension.size() == 0) {
    dimensionCopy.push_back(data.size());
  } else {
    dimensionCopy = dimension;
  }
  if (!isDimensionConsistent(data.size(), dimensionCopy))
    throw std::range_error(
        "Dimension of the data does not correspond to sent dimensions");
  // Insert the length of the longest string
  size_t first_dim(0);
  for (unsigned int i = 0; i < data.size(); ++i)
    if (data[i].size() > first_dim)
      first_dim = data[i].size();
  std::vector<size_t> dimensionWithStrLen = dimensionCopy;
  dimensionWithStrLen.insert(dimensionWithStrLen.begin(), first_dim);

  _data_type = ezc3d::DATA_TYPE::CHAR;
  _param_data_string = data;
  _dimension = dimensionWithStrLen;
  setEmptyFlag();
}